

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

int __thiscall cppcms::http::request::on_content_progress(request *this,size_t n)

{
  basic_content_filter *pbVar1;
  long lVar2;
  bool bVar3;
  _data *p_Var4;
  reference pvVar5;
  multipart_parser *pmVar6;
  istream *piVar7;
  size_type sVar8;
  long in_RSI;
  long in_RDI;
  hold_ptr<cppcms::http::request::_data> *this_00;
  abort_upload *ab;
  exception *e;
  file_ptr f_3;
  iterator p;
  files_type mp;
  vector<char,_std::allocator<char>_> tmp;
  char *data_end;
  char *data;
  file *f_2;
  file *f_1;
  file *f;
  longlong allowed;
  parsing_result_type r;
  char *end;
  char *begin;
  file *in_stack_fffffffffffffbb8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbc0;
  multipart_parser *in_stack_fffffffffffffbc8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  multipart_parser *in_stack_fffffffffffffbd8;
  request *in_stack_fffffffffffffbe0;
  multipart_parser *in_stack_fffffffffffffc00;
  istream *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  multipart_parser *in_stack_fffffffffffffc68;
  form_type *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  request *in_stack_fffffffffffffc98;
  longlong in_stack_fffffffffffffca8;
  file *in_stack_fffffffffffffcb0;
  request *in_stack_fffffffffffffcb8;
  string local_148 [32];
  string local_128 [112];
  shared_ptr<cppcms::http::file> *local_b8;
  __normal_iterator<std::shared_ptr<cppcms::http::file>_*,_std::vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>_>
  local_b0 [7];
  reference local_78;
  reference local_70;
  undefined8 local_68;
  undefined8 local_60;
  file *local_58;
  file *local_50;
  file *local_48;
  longlong local_40;
  parsing_result_type local_38;
  reference local_28;
  reference local_20;
  long local_18;
  
  if (in_RSI != 0) {
    this_00 = (hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0);
    local_18 = in_RSI;
    p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->(this_00);
    local_20 = std::vector<char,_std::allocator<char>_>::operator[](&p_Var4->post_data,0);
    lVar2 = local_18;
    local_28 = local_20 + local_18;
    p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->(this_00);
    p_Var4->read_size = p_Var4->read_size + lVar2;
    p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->(this_00);
    if ((p_Var4->filter_is_raw_content_filter & 1U) != 0) {
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      pbVar1 = p_Var4->filter;
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&p_Var4->post_data,0);
      (*pbVar1->_vptr_basic_content_filter[4])(pbVar1,pvVar5,local_18);
    }
    p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                       ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
    pmVar6 = booster::hold_ptr<cppcms::impl::multipart_parser>::get(&p_Var4->multipart_parser);
    if (pmVar6 != (multipart_parser *)0x0) {
      local_38 = continue_input;
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      local_40 = content_limits::content_length_limit(&p_Var4->limits);
      while (local_20 != local_28) {
        p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                           ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        booster::hold_ptr<cppcms::impl::multipart_parser>::operator->(&p_Var4->multipart_parser);
        local_38 = cppcms::impl::multipart_parser::consume
                             (in_stack_fffffffffffffc68,
                              (char **)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60)
                              ,in_stack_fffffffffffffc58);
        switch(local_38) {
        case parsing_error:
          return 400;
        case meta_ready:
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          if ((p_Var4->filter_is_multipart_filter & 1U) != 0) {
            p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                               ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
            booster::hold_ptr<cppcms::impl::multipart_parser>::operator->(&p_Var4->multipart_parser)
            ;
            local_48 = cppcms::impl::multipart_parser::get_file(in_stack_fffffffffffffc00);
            p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                               ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
            (*p_Var4->filter->_vptr_basic_content_filter[4])(p_Var4->filter,local_48);
          }
          break;
        case content_partial:
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          booster::hold_ptr<cppcms::impl::multipart_parser>::operator->(&p_Var4->multipart_parser);
          local_50 = cppcms::impl::multipart_parser::get_file(in_stack_fffffffffffffc00);
          bVar3 = size_ok(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                          in_stack_fffffffffffffca8);
          if (!bVar3) {
            return 0x19d;
          }
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          if ((p_Var4->filter_is_multipart_filter & 1U) != 0) {
            p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                               ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
            (*p_Var4->filter->_vptr_basic_content_filter[5])(p_Var4->filter,local_50);
          }
          break;
        case content_ready:
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          booster::hold_ptr<cppcms::impl::multipart_parser>::operator->(&p_Var4->multipart_parser);
          local_58 = cppcms::impl::multipart_parser::last_file(in_stack_fffffffffffffc00);
          piVar7 = file::data((file *)0x3901d7);
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_fffffffffffffbc0,
                     (streamoff)in_stack_fffffffffffffbb8);
          std::istream::seekg(piVar7,local_68,local_60);
          bVar3 = size_ok(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                          in_stack_fffffffffffffca8);
          if (!bVar3) {
            return 0x19d;
          }
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          if ((p_Var4->filter_is_multipart_filter & 1U) != 0) {
            p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                               ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
            (*p_Var4->filter->_vptr_basic_content_filter[6])(p_Var4->filter,local_58);
          }
          break;
        case continue_input:
          break;
        case eof:
          if (local_20 != local_28) {
            return 400;
          }
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          lVar2 = p_Var4->read_size;
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          if (lVar2 != p_Var4->content_length) {
            return 400;
          }
          break;
        case no_room_left:
          return 0x19d;
        default:
          return 400;
        }
      }
      if (local_20 == local_28) {
        p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                           ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        lVar2 = p_Var4->read_size;
        p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                           ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        if ((lVar2 == p_Var4->content_length) && (local_38 != eof)) {
          return 400;
        }
      }
    }
    p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                       ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
    lVar2 = p_Var4->read_size;
    p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                       ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
    if (lVar2 == p_Var4->content_length) {
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      if ((p_Var4->read_full & 1U) == 0) {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)0x3905ba);
        booster::hold_ptr<cppcms::http::request::_data>::operator->
                  ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        std::vector<char,_std::allocator<char>_>::swap
                  (in_stack_fffffffffffffbd0,
                   (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffbc8);
        std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffbd0);
      }
      else {
        lazy_content_type(in_stack_fffffffffffffbe0);
        bVar3 = http::content_type::is_form_urlencoded((content_type *)in_stack_fffffffffffffbb8);
        if (bVar3) {
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&p_Var4->post_data,0);
          local_70 = pvVar5;
          p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                             ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
          sVar8 = std::vector<char,_std::allocator<char>_>::size(&p_Var4->post_data);
          local_78 = pvVar5 + sVar8;
          parse_form_urlencoded
                    (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     in_stack_fffffffffffffc80);
        }
      }
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      if (p_Var4->filter != (basic_content_filter *)0x0) {
        p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                           ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        (*p_Var4->filter->_vptr_basic_content_filter[2])();
      }
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      pmVar6 = booster::hold_ptr<cppcms::impl::multipart_parser>::get(&p_Var4->multipart_parser);
      if (pmVar6 != (multipart_parser *)0x0) {
        p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                           ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        booster::hold_ptr<cppcms::impl::multipart_parser>::operator->(&p_Var4->multipart_parser);
        cppcms::impl::multipart_parser::get_files(in_stack_fffffffffffffbd8);
        booster::hold_ptr<cppcms::http::request::_data>::operator->
                  ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
        booster::hold_ptr<cppcms::impl::multipart_parser>::reset
                  ((hold_ptr<cppcms::impl::multipart_parser> *)in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8);
        local_b0[0]._M_current =
             (shared_ptr<cppcms::http::file> *)
             std::
             vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
             ::begin((vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                      *)in_stack_fffffffffffffbb8);
        while( true ) {
          local_b8 = (shared_ptr<cppcms::http::file> *)
                     std::
                     vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                     ::end((vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                            *)in_stack_fffffffffffffbb8);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::shared_ptr<cppcms::http::file>_*,_std::vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>_>
                              *)in_stack_fffffffffffffbc0,
                             (__normal_iterator<std::shared_ptr<cppcms::http::file>_*,_std::vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>_>
                              *)in_stack_fffffffffffffbb8);
          if (!bVar3) break;
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<cppcms::http::file>_*,_std::vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>_>
          ::operator*(local_b0);
          std::shared_ptr<cppcms::http::file>::shared_ptr
                    ((shared_ptr<cppcms::http::file> *)in_stack_fffffffffffffbc0,
                     (shared_ptr<cppcms::http::file> *)in_stack_fffffffffffffbb8);
          std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3907d0);
          bVar3 = file::has_mime((file *)0x3907d8);
          if (bVar3) {
            std::
            vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
            ::push_back((vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                         *)in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
          }
          else {
            std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x390813);
            file::name_abi_cxx11_(in_stack_fffffffffffffbb8);
            std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x390832);
            file::size((file *)0x39083a);
            std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x390851);
            file::data((file *)0x390859);
            (anonymous_namespace)::read_file_abi_cxx11_
                      (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
            std::make_pair<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffbc8,&in_stack_fffffffffffffbc0->first);
            std::
            multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffbb8,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x3908b6);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(in_stack_fffffffffffffbc0);
            std::__cxx11::string::~string(local_148);
            std::__cxx11::string::~string(local_128);
          }
          std::shared_ptr<cppcms::http::file>::~shared_ptr
                    ((shared_ptr<cppcms::http::file> *)0x3909c1);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<cppcms::http::file>_*,_std::vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>_>
          ::operator++(local_b0);
        }
        std::
        vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
        ::~vector((vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                   *)in_stack_fffffffffffffbd0);
      }
      p_Var4 = booster::hold_ptr<cppcms::http::request::_data>::operator->
                         ((hold_ptr<cppcms::http::request::_data> *)(in_RDI + 0xc0));
      p_Var4->ready = true;
    }
  }
  return 0;
}

Assistant:

int request::on_content_progress(size_t n)
{
	if(n==0)
		return 0;
	char const *begin = &d->post_data[0];
	char const *end = begin + n;
	d->read_size += n;
	try {
		if(d->filter_is_raw_content_filter) {
			static_cast<raw_content_filter *>(d->filter)->on_data_chunk(&d->post_data[0],n);
		}

		if(d->multipart_parser.get()) {
			multipart_parser::parsing_result_type r = multipart_parser::continue_input;

			long long allowed=d->limits.content_length_limit();

			while(begin!=end) {
				r = d->multipart_parser->consume(begin,end);
				
				switch(r) { 
				case multipart_parser::meta_ready: 	
					{
						if(d->filter_is_multipart_filter) { 
							file &f=d->multipart_parser->get_file();
							static_cast<multipart_filter *>(d->filter)->on_new_file(f); 
						}
					}
					break;
				case multipart_parser::content_partial:
					{
						file &f=d->multipart_parser->get_file();
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_upload_progress(f);
					}
					break;
				case multipart_parser::content_ready:	
					{
						file &f=d->multipart_parser->last_file();
						f.data().seekg(0);
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_data_ready(f);
					}
					break;
				case multipart_parser::continue_input:
					break;
				case multipart_parser::no_room_left:
					return 413;
				case multipart_parser::eof:
					if(begin!=end) 
						return 400;
					if(d->read_size != d->content_length) 
						return 400;
					break;
				case multipart_parser::parsing_error:
				default:
					return 400;
				}
			}
			if(begin==end && d->read_size==d->content_length && r!=multipart_parser::eof) {
				return 400;
			}
		}

		if(d->read_size == d->content_length) {
			if(d->read_full) {
				if(lazy_content_type().is_form_urlencoded()) {
					char const *data = &d->post_data[0];
					char const *data_end = data + d->post_data.size();
					parse_form_urlencoded(data,data_end,post_);
				}
			}
			else {
				std::vector<char> tmp;
				tmp.swap(d->post_data);
			}
			if(d->filter)
				d->filter->on_end_of_content();
			if(d->multipart_parser.get()) {
				multipart_parser::files_type mp=d->multipart_parser->get_files();
				d->multipart_parser.reset();
				
				for(multipart_parser::files_type::iterator p=mp.begin();p!=mp.end();++p) {
					multipart_parser::file_ptr f=*p;
					if(!f->has_mime()) 
						post_.insert(std::make_pair(f->name(),read_file(f->size(),f->data())));
					else 
						files_.push_back(f);
				}
			}
			d->ready = true;
		}
	}
	catch(abort_upload const &ab) {
		d->no_on_error=true;
		return ab.code();
	}
	catch(std::exception const &e) {
		BOOSTER_ERROR("cppcms") << e.what() << booster::trace(e);
		d->no_on_error=true;
		return 500;
	}
	catch(...) {
		BOOSTER_ERROR("cppcms") << "Unknown exception ";
		d->no_on_error=true;
		return 500;
	}
	return 0;
}